

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

void deflate_near_optimal_merge_stats(libdeflate_compressor *c)

{
  u32 *puVar1;
  int *piVar2;
  long lVar3;
  
  lVar3 = -0x28;
  do {
    piVar2 = (int *)((long)(c->split_stats).observations + lVar3 + 0x28);
    *piVar2 = *piVar2 + *(int *)((long)(c->split_stats).observations + lVar3);
    *(undefined4 *)((long)(c->split_stats).observations + lVar3) = 0;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  puVar1 = &(c->split_stats).num_observations;
  *puVar1 = *puVar1 + (c->split_stats).num_new_observations;
  (c->split_stats).num_new_observations = 0;
  lVar3 = -0x103;
  do {
    piVar2 = (int *)((long)&c->p + lVar3 * 4 + 0x896a24);
    *piVar2 = *piVar2 + *(int *)((long)&c->p + lVar3 * 4 + 0x896618);
    *(undefined4 *)((long)&c->p + lVar3 * 4 + 0x896618) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  return;
}

Assistant:

static void
deflate_near_optimal_merge_stats(struct libdeflate_compressor *c)
{
	unsigned i;

	merge_new_observations(&c->split_stats);
	for (i = 0; i < ARRAY_LEN(c->p.n.match_len_freqs); i++) {
		c->p.n.match_len_freqs[i] += c->p.n.new_match_len_freqs[i];
		c->p.n.new_match_len_freqs[i] = 0;
	}
}